

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::DrawIndirectBase::getDataSize(DrawIndirectBase *this,int *width,int *height)

{
  int *piVar1;
  int local_30;
  int local_2c [3];
  int *local_20;
  int *height_local;
  int *width_local;
  DrawIndirectBase *this_local;
  
  local_20 = height;
  height_local = width;
  width_local = (int *)this;
  local_2c[2] = getWindowWidth(this);
  local_2c[1] = 0x4000;
  piVar1 = std::min<int>(local_2c + 2,local_2c + 1);
  *height_local = *piVar1;
  local_2c[0] = getWindowHeight(this);
  local_30 = (int)(0x10000 / (long)*height_local);
  piVar1 = std::min<int>(local_2c,&local_30);
  *local_20 = *piVar1;
  return;
}

Assistant:

void getDataSize(int& width, int& height)
	{
		width  = std::min(getWindowWidth(), 16384);				 // Cap width to 16384
		height = std::min(getWindowHeight(), 4 * 16384 / width); // Height is 4 if width is capped
	}